

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::AddCUDAToolkitFlags(cmGeneratorTarget *this,string *flags)

{
  cmMakefile *pcVar1;
  cmLocalGenerator *pcVar2;
  string_view source;
  bool bVar3;
  string *psVar4;
  ulong uVar5;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  string local_98;
  string local_78 [8];
  string toolkitRoot;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *compiler;
  string *flags_local;
  cmGeneratorTarget *this_local;
  
  pcVar1 = this->Makefile;
  compiler = flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_CUDA_COMPILER_ID",&local_41);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = psVar4;
  bVar3 = std::operator==(psVar4,"Clang");
  if (bVar3) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CMAKE_CUDA_COMPILER_LIBRARY_ROOT",&local_99);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_98);
    std::__cxx11::string::string(local_78,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar2 = this->LocalGenerator;
      source = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_78);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_e0,&pcVar2->super_cmOutputConverter,source,SHELL);
      std::operator+(&local_c0," --cuda-path=",&local_e0);
      std::__cxx11::string::operator+=((string *)compiler,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    std::__cxx11::string::~string(local_78);
  }
  return;
}

Assistant:

void cmGeneratorTarget::AddCUDAToolkitFlags(std::string& flags) const
{
  std::string const& compiler =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_ID");

  if (compiler == "Clang") {
    // Pass CUDA toolkit explicitly to Clang.
    // Clang's searching for the system CUDA toolkit isn't very good and it's
    // expected the user will explicitly pass the toolkit path.
    // This also avoids Clang having to search for the toolkit on every
    // invocation.
    std::string toolkitRoot =
      this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_LIBRARY_ROOT");

    if (!toolkitRoot.empty()) {
      flags += " --cuda-path=" +
        this->LocalGenerator->ConvertToOutputFormat(toolkitRoot,
                                                    cmOutputConverter::SHELL);
    }
  }
}